

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_8x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  undefined1 (*pauVar1) [16];
  byte bVar2;
  code *pcVar3;
  int8_t *piVar4;
  long lVar5;
  undefined7 in_register_00000009;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  bool bVar13;
  __m128i round;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  int iVar26;
  undefined1 in_XMM6 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar27 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  __m128i out [32];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  int local_458;
  int iStack_454;
  int iStack_450;
  int iStack_44c;
  undefined1 local_448 [16];
  int local_438;
  int iStack_434;
  int iStack_430;
  int iStack_42c;
  int local_428;
  int iStack_424;
  int iStack_420;
  int iStack_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  undefined8 local_388;
  int iStack_380;
  int iStack_37c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_368;
  int iStack_364;
  int iStack_360;
  int iStack_35c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  undefined8 local_348;
  int iStack_340;
  int iStack_33c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  int iStack_210;
  int iStack_20c;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  undefined8 local_1d8;
  int iStack_1d0;
  int iStack_1cc;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  undefined8 local_158;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  int iStack_90;
  int iStack_8c;
  undefined1 local_88 [16];
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  int iStack_50;
  int iStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar4 = av1_fwd_txfm_shift_ls[7];
  uVar11 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  bVar13 = 0xf < tx_type;
  uVar8 = 0xbeaf >> (tx_type & 0x1f);
  uVar6 = 0x7f1f >> (tx_type & 0x1f);
  iVar10 = (int)*av1_fwd_txfm_shift_ls[7];
  pauVar1 = (undefined1 (*) [16])(input + stride * 8);
  if ((uVar8 & 1) != 0 || bVar13) {
    local_518 = *(undefined1 (*) [16])input;
    local_508 = *(undefined1 (*) [16])(input + stride);
    local_4f8 = *(undefined1 (*) [16])(input + stride * 2);
    local_4e8 = *(undefined1 (*) [16])(input + stride * 3);
    local_4d8 = *(undefined1 (*) [16])(input + stride * 4);
    local_4c8 = *(undefined1 (*) [16])(input + stride * 5);
    local_4b8 = *(undefined1 (*) [16])(input + stride * 6);
    pauVar12 = (undefined1 (*) [16])(input + stride * 7);
    input = (int16_t *)pauVar1;
  }
  else {
    local_518 = *(undefined1 (*) [16])(*pauVar1 + (long)(stride * 7) * 2);
    local_508 = *(undefined1 (*) [16])(*pauVar1 + (long)(stride * 6) * 2);
    local_4f8 = *(undefined1 (*) [16])(*pauVar1 + (long)(stride * 5) * 2);
    local_4e8 = *(undefined1 (*) [16])(*pauVar1 + (long)(stride * 4) * 2);
    local_4d8 = *(undefined1 (*) [16])(*pauVar1 + (long)(stride * 3) * 2);
    local_4c8 = *(undefined1 (*) [16])(*pauVar1 + (long)(stride * 2) * 2);
    local_4b8 = *(undefined1 (*) [16])(*pauVar1 + (long)stride * 2);
    pauVar12 = pauVar1;
  }
  pcVar3 = *(code **)((long)row_highbd_txfm8x8_arr + uVar11);
  local_4a8 = *pauVar12;
  if ((uVar6 & 1) == 0 && !bVar13) {
    local_518 = pshufb(local_518,_DAT_005697a0);
    in_XMM2 = pshufb(local_508,_DAT_005697a0);
    local_4f8 = pshufb(local_4f8,_DAT_005697a0);
    in_XMM4 = pshufb(local_4e8,_DAT_005697a0);
    local_4d8 = pshufb(local_4d8,_DAT_005697a0);
    local_4c8 = pshufb(local_4c8,_DAT_005697a0);
    local_4b8 = pshufb(local_4b8,_DAT_005697a0);
    local_4a8 = pshufb(local_4a8,_DAT_005697a0);
    local_508 = in_XMM2;
    local_4e8 = in_XMM4;
  }
  auVar27 = pmovsxwd(in_XMM7,local_4d8);
  auVar16._8_4_ = local_4d8._8_4_;
  auVar16._12_4_ = local_4d8._12_4_;
  auVar16._0_8_ = local_4d8._8_8_;
  auVar28 = pmovsxwd(in_XMM8,auVar16);
  auVar18 = pmovsxwd(in_XMM2,local_4c8);
  auVar19._8_4_ = local_4c8._8_4_;
  auVar19._12_4_ = local_4c8._12_4_;
  auVar19._0_8_ = local_4c8._8_8_;
  auVar20 = pmovsxwd(in_XMM4,auVar19);
  auVar22 = pmovsxwd(in_XMM5,local_4b8);
  auVar29._8_4_ = local_4b8._8_4_;
  auVar29._12_4_ = local_4b8._12_4_;
  auVar29._0_8_ = local_4b8._8_8_;
  auVar25 = pmovsxwd(in_XMM6,auVar29);
  auVar16 = pmovsxwd(auVar29,local_4a8);
  auVar31._8_4_ = local_4a8._8_4_;
  auVar31._12_4_ = local_4a8._12_4_;
  auVar31._0_8_ = local_4a8._8_8_;
  auVar19 = pmovsxwd(auVar31,auVar31);
  auVar29 = pmovsxwd(in_XMM9,local_4e8);
  auVar34._8_4_ = local_4e8._8_4_;
  auVar34._12_4_ = local_4e8._12_4_;
  auVar34._0_8_ = local_4e8._8_8_;
  auVar31 = pmovsxwd(auVar34,auVar34);
  auVar36 = pmovsxwd(in_XMM12,local_4f8);
  auVar37._8_4_ = local_4f8._8_4_;
  auVar37._12_4_ = local_4f8._12_4_;
  auVar37._0_8_ = local_4f8._8_8_;
  auVar34 = pmovsxwd(auVar37,auVar37);
  auVar37 = pmovsxwd(in_XMM13,local_508);
  auVar14._8_4_ = local_508._8_4_;
  auVar14._12_4_ = local_508._12_4_;
  auVar14._0_8_ = local_508._8_8_;
  auVar39 = pmovsxwd(in_XMM14,auVar14);
  auVar40 = pmovsxwd(in_XMM15,local_518);
  auVar21._8_4_ = local_518._8_4_;
  auVar21._12_4_ = local_518._12_4_;
  auVar21._0_8_ = local_518._8_8_;
  auVar14 = pmovsxwd(auVar21,auVar21);
  local_518._4_4_ = auVar40._4_4_;
  local_518._0_4_ = auVar40._0_4_ << iVar10;
  local_518._8_4_ = auVar40._8_4_;
  local_518._12_4_ = auVar40._12_4_;
  local_508._4_4_ = auVar14._4_4_;
  local_508._0_4_ = auVar14._0_4_ << iVar10;
  local_508._8_4_ = auVar14._8_4_;
  local_508._12_4_ = auVar14._12_4_;
  local_4e8._0_4_ = auVar39._0_4_ << iVar10;
  local_4e8._4_4_ = auVar39._4_4_;
  local_4e8._8_4_ = auVar39._8_4_;
  local_4e8._12_4_ = auVar39._12_4_;
  local_4f8._4_4_ = auVar37._4_4_;
  local_4f8._0_4_ = auVar37._0_4_ << iVar10;
  local_4f8._8_4_ = auVar37._8_4_;
  local_4f8._12_4_ = auVar37._12_4_;
  local_4d8._0_4_ = auVar36._0_4_ << iVar10;
  local_4d8._4_4_ = auVar36._4_4_;
  local_4d8._8_4_ = auVar36._8_4_;
  local_4d8._12_4_ = auVar36._12_4_;
  local_4c8._4_4_ = auVar34._4_4_;
  local_4c8._0_4_ = auVar34._0_4_ << iVar10;
  local_4c8._8_4_ = auVar34._8_4_;
  local_4c8._12_4_ = auVar34._12_4_;
  local_4b8._0_4_ = auVar29._0_4_ << iVar10;
  local_4b8._4_4_ = auVar29._4_4_;
  local_4b8._8_4_ = auVar29._8_4_;
  local_4b8._12_4_ = auVar29._12_4_;
  local_4a8._4_4_ = auVar31._4_4_;
  local_4a8._0_4_ = auVar31._0_4_ << iVar10;
  local_4a8._8_4_ = auVar31._8_4_;
  local_4a8._12_4_ = auVar31._12_4_;
  local_498._0_4_ = auVar27._0_4_ << iVar10;
  local_498._4_4_ = auVar27._4_4_;
  local_498._8_4_ = auVar27._8_4_;
  local_498._12_4_ = auVar27._12_4_;
  local_488._0_4_ = auVar28._0_4_ << iVar10;
  local_488._4_4_ = auVar28._4_4_;
  local_488._8_4_ = auVar28._8_4_;
  local_488._12_4_ = auVar28._12_4_;
  local_478._0_4_ = auVar18._0_4_ << iVar10;
  local_478._4_4_ = auVar18._4_4_;
  local_478._8_4_ = auVar18._8_4_;
  local_478._12_4_ = auVar18._12_4_;
  local_468._0_4_ = auVar20._0_4_ << iVar10;
  local_468._4_4_ = auVar20._4_4_;
  local_468._8_4_ = auVar20._8_4_;
  local_468._12_4_ = auVar20._12_4_;
  iStack_454 = auVar22._4_4_;
  local_458 = auVar22._0_4_ << iVar10;
  iStack_450 = auVar22._8_4_;
  iStack_44c = auVar22._12_4_;
  local_448._0_4_ = auVar25._0_4_ << iVar10;
  local_448._4_4_ = auVar25._4_4_;
  local_448._8_4_ = auVar25._8_4_;
  local_448._12_4_ = auVar25._12_4_;
  iStack_434 = auVar16._4_4_;
  local_438 = auVar16._0_4_ << iVar10;
  iStack_430 = auVar16._8_4_;
  iStack_42c = auVar16._12_4_;
  iStack_424 = auVar19._4_4_;
  local_428 = auVar19._0_4_ << iVar10;
  iStack_420 = auVar19._8_4_;
  iStack_41c = auVar19._12_4_;
  if ((uVar8 & 1) == 0 && !bVar13) {
    local_418 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 7) * 2);
    local_408 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 6) * 2);
    local_3f8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 5) * 2);
    local_3e8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 4) * 2);
    lVar9 = (long)(stride * 3);
    local_3d8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + lVar9 * 2);
    uVar7 = (ulong)(stride * 2);
    local_3c8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + uVar7 * 2);
    local_3b8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)stride * 2);
  }
  else {
    local_418 = *(undefined1 (*) [16])input;
    local_408 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)stride * 2);
    local_3f8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 2) * 2);
    local_3e8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 3) * 2);
    local_3d8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 4) * 2);
    local_3c8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 5) * 2);
    lVar9 = (long)(stride * 6);
    local_3b8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + lVar9 * 2);
    uVar7 = (ulong)(uint)(stride * 7);
    input = (int16_t *)(*(undefined1 (*) [16])input + (long)(stride * 7) * 2);
  }
  auVar14 = local_478;
  auVar21 = local_468;
  local_3a8 = *(undefined1 (*) [16])input;
  if ((uVar6 & 1) == 0 && !bVar13) {
    local_418 = pshufb(local_418,_DAT_005697a0);
    local_408 = pshufb(local_408,_DAT_005697a0);
    auVar21 = pshufb(local_3f8,_DAT_005697a0);
    local_3e8 = pshufb(local_3e8,_DAT_005697a0);
    local_3d8 = pshufb(local_3d8,_DAT_005697a0);
    local_3c8 = pshufb(local_3c8,_DAT_005697a0);
    local_3b8 = pshufb(local_3b8,_DAT_005697a0);
    auVar14 = pshufb(*(undefined1 (*) [16])input,_DAT_005697a0);
    local_3f8 = auVar21;
    local_3a8 = auVar14;
  }
  auVar16 = pmovsxwd(auVar14,local_3d8);
  auVar18._8_4_ = local_3d8._8_4_;
  auVar18._12_4_ = local_3d8._12_4_;
  auVar18._0_8_ = local_3d8._8_8_;
  auVar31 = pmovsxwd(local_448,auVar18);
  auVar22 = pmovsxwd(local_498,local_3c8);
  auVar20._8_4_ = local_3c8._8_4_;
  auVar20._12_4_ = local_3c8._12_4_;
  auVar20._0_8_ = local_3c8._8_8_;
  auVar25 = pmovsxwd(local_488,auVar20);
  auVar14 = pmovsxwd(auVar20,local_3b8);
  auVar28._8_4_ = local_3b8._8_4_;
  auVar28._12_4_ = local_3b8._12_4_;
  auVar28._0_8_ = local_3b8._8_8_;
  auVar19 = pmovsxwd(auVar28,auVar28);
  auVar29 = pmovsxwd(auVar21,local_3a8);
  auVar23._8_4_ = local_3a8._8_4_;
  auVar23._12_4_ = local_3a8._12_4_;
  auVar23._0_8_ = local_3a8._8_8_;
  auVar18 = pmovsxwd(auVar23,auVar23);
  auVar20 = pmovsxwd(local_4b8,local_3e8);
  auVar32._8_4_ = local_3e8._8_4_;
  auVar32._12_4_ = local_3e8._12_4_;
  auVar32._0_8_ = local_3e8._8_8_;
  auVar27 = pmovsxwd(auVar32,auVar32);
  auVar34 = pmovsxwd(local_4d8,local_3f8);
  auVar38._8_4_ = local_3f8._8_4_;
  auVar38._12_4_ = local_3f8._12_4_;
  auVar38._0_8_ = local_3f8._8_8_;
  auVar37 = pmovsxwd(auVar38,auVar38);
  auVar36 = pmovsxwd(local_4e8,local_408);
  auVar35._8_4_ = local_408._8_4_;
  auVar35._12_4_ = local_408._12_4_;
  auVar35._0_8_ = local_408._8_8_;
  auVar28 = pmovsxwd(auVar35,auVar35);
  auVar21 = pmovsxwd(auVar14,local_418);
  auVar41._8_4_ = local_418._8_4_;
  auVar41._12_4_ = local_418._12_4_;
  auVar41._0_8_ = local_418._8_8_;
  auVar39 = pmovsxwd(auVar41,auVar41);
  local_418._4_4_ = auVar21._4_4_;
  local_418._0_4_ = auVar21._0_4_ << iVar10;
  local_418._8_4_ = auVar21._8_4_;
  local_418._12_4_ = auVar21._12_4_;
  local_408._4_4_ = auVar39._4_4_;
  local_408._0_4_ = auVar39._0_4_ << iVar10;
  local_408._8_4_ = auVar39._8_4_;
  local_408._12_4_ = auVar39._12_4_;
  local_3f8._4_4_ = auVar36._4_4_;
  local_3f8._0_4_ = auVar36._0_4_ << iVar10;
  local_3f8._8_4_ = auVar36._8_4_;
  local_3f8._12_4_ = auVar36._12_4_;
  local_3e8._4_4_ = auVar28._4_4_;
  local_3e8._0_4_ = auVar28._0_4_ << iVar10;
  local_3e8._8_4_ = auVar28._8_4_;
  local_3e8._12_4_ = auVar28._12_4_;
  local_3d8._4_4_ = auVar34._4_4_;
  local_3d8._0_4_ = auVar34._0_4_ << iVar10;
  local_3d8._8_4_ = auVar34._8_4_;
  local_3d8._12_4_ = auVar34._12_4_;
  local_3c8._4_4_ = auVar37._4_4_;
  local_3c8._0_4_ = auVar37._0_4_ << iVar10;
  local_3c8._8_4_ = auVar37._8_4_;
  local_3c8._12_4_ = auVar37._12_4_;
  local_3b8._4_4_ = auVar20._4_4_;
  local_3b8._0_4_ = auVar20._0_4_ << iVar10;
  local_3b8._8_4_ = auVar20._8_4_;
  local_3b8._12_4_ = auVar20._12_4_;
  local_3a8._4_4_ = auVar27._4_4_;
  local_3a8._0_4_ = auVar27._0_4_ << iVar10;
  local_3a8._8_4_ = auVar27._8_4_;
  local_3a8._12_4_ = auVar27._12_4_;
  iStack_394 = auVar16._4_4_;
  local_398 = auVar16._0_4_ << iVar10;
  iStack_390 = auVar16._8_4_;
  iStack_38c = auVar16._12_4_;
  local_388._4_4_ = auVar31._4_4_;
  local_388._0_4_ = auVar31._0_4_ << iVar10;
  iStack_380 = auVar31._8_4_;
  iStack_37c = auVar31._12_4_;
  iStack_374 = auVar22._4_4_;
  local_378 = auVar22._0_4_ << iVar10;
  iStack_370 = auVar22._8_4_;
  iStack_36c = auVar22._12_4_;
  iStack_364 = auVar25._4_4_;
  local_368 = auVar25._0_4_ << iVar10;
  iStack_360 = auVar25._8_4_;
  iStack_35c = auVar25._12_4_;
  iStack_354 = auVar14._4_4_;
  local_358 = auVar14._0_4_ << iVar10;
  iStack_350 = auVar14._8_4_;
  iStack_34c = auVar14._12_4_;
  local_348._4_4_ = auVar19._4_4_;
  local_348._0_4_ = auVar19._0_4_ << iVar10;
  iStack_340 = auVar19._8_4_;
  iStack_33c = auVar19._12_4_;
  iStack_334 = auVar29._4_4_;
  local_338 = auVar29._0_4_ << iVar10;
  iStack_330 = auVar29._8_4_;
  iStack_32c = auVar29._12_4_;
  iStack_324 = auVar18._4_4_;
  local_328 = auVar18._0_4_ << iVar10;
  iStack_320 = auVar18._8_4_;
  iStack_31c = auVar18._12_4_;
  (**(code **)((long)col_highbd_txfm8x16_arr + uVar11))
            (local_518,local_518,0xd,2,uVar7,lVar9,auVar14);
  bVar2 = piVar4[1];
  iVar10 = 1 << (~bVar2 & 0x1f);
  auVar14 = ZEXT416((uint)-(int)(char)bVar2);
  local_2d8 = local_518._0_4_ + iVar10 >> auVar14;
  iStack_2d4 = local_518._4_4_ + iVar10 >> auVar14;
  iStack_2d0 = local_518._8_4_ + iVar10 >> auVar14;
  iStack_2cc = local_518._12_4_ + iVar10 >> auVar14;
  local_518._4_4_ = iStack_2d4;
  local_518._0_4_ = local_2d8;
  local_518._8_4_ = iStack_2d0;
  local_518._12_4_ = iStack_2cc;
  iStack_190 = local_508._4_4_ + iVar10 >> auVar14;
  iStack_150 = local_508._12_4_ + iVar10 >> auVar14;
  local_2e8 = local_4f8._0_4_ + iVar10 >> auVar14;
  iStack_2e4 = local_4f8._4_4_ + iVar10 >> auVar14;
  iStack_2e0 = local_4f8._8_4_ + iVar10 >> auVar14;
  iStack_2dc = local_4f8._12_4_ + iVar10 >> auVar14;
  local_508._4_4_ = iStack_190;
  local_508._0_4_ = local_508._0_4_ + iVar10 >> auVar14;
  local_508._8_4_ = local_508._8_4_ + iVar10 >> auVar14;
  local_508._12_4_ = iStack_150;
  local_4f8._4_4_ = iStack_2e4;
  local_4f8._0_4_ = local_2e8;
  local_4f8._8_4_ = iStack_2e0;
  local_4f8._12_4_ = iStack_2dc;
  local_288 = local_4e8._0_4_ + iVar10 >> auVar14;
  iStack_284 = local_4e8._4_4_ + iVar10 >> auVar14;
  iStack_280 = local_4e8._8_4_ + iVar10 >> auVar14;
  iStack_27c = local_4e8._12_4_ + iVar10 >> auVar14;
  local_4e8._4_4_ = iStack_284;
  local_4e8._0_4_ = local_288;
  local_4e8._8_4_ = iStack_280;
  local_4e8._12_4_ = iStack_27c;
  local_2f8 = local_4d8._0_4_ + iVar10 >> auVar14;
  iStack_2f4 = local_4d8._4_4_ + iVar10 >> auVar14;
  iStack_2f0 = local_4d8._8_4_ + iVar10 >> auVar14;
  iStack_2ec = local_4d8._12_4_ + iVar10 >> auVar14;
  local_4d8._4_4_ = iStack_2f4;
  local_4d8._0_4_ = local_2f8;
  local_4d8._8_4_ = iStack_2f0;
  local_4d8._12_4_ = iStack_2ec;
  local_2a8 = local_4c8._0_4_ + iVar10 >> auVar14;
  iStack_2a4 = local_4c8._4_4_ + iVar10 >> auVar14;
  iStack_2a0 = local_4c8._8_4_ + iVar10 >> auVar14;
  iStack_29c = local_4c8._12_4_ + iVar10 >> auVar14;
  local_308 = local_4b8._0_4_ + iVar10 >> auVar14;
  iStack_304 = local_4b8._4_4_ + iVar10 >> auVar14;
  iStack_300 = local_4b8._8_4_ + iVar10 >> auVar14;
  iStack_2fc = local_4b8._12_4_ + iVar10 >> auVar14;
  local_4c8._4_4_ = iStack_2a4;
  local_4c8._0_4_ = local_2a8;
  local_4c8._8_4_ = iStack_2a0;
  local_4c8._12_4_ = iStack_29c;
  local_4b8._4_4_ = iStack_304;
  local_4b8._0_4_ = local_308;
  local_4b8._8_4_ = iStack_300;
  local_4b8._12_4_ = iStack_2fc;
  local_2c8 = local_4a8._0_4_ + iVar10 >> auVar14;
  iStack_2c4 = local_4a8._4_4_ + iVar10 >> auVar14;
  iStack_2c0 = local_4a8._8_4_ + iVar10 >> auVar14;
  iStack_2bc = local_4a8._12_4_ + iVar10 >> auVar14;
  local_4a8._4_4_ = iStack_2c4;
  local_4a8._0_4_ = local_2c8;
  local_4a8._8_4_ = iStack_2c0;
  local_4a8._12_4_ = iStack_2bc;
  local_278 = local_498._0_4_ + iVar10 >> auVar14;
  iStack_274 = local_498._4_4_ + iVar10 >> auVar14;
  iStack_270 = local_498._8_4_ + iVar10 >> auVar14;
  iStack_26c = local_498._12_4_ + iVar10 >> auVar14;
  local_498._4_4_ = iStack_274;
  local_498._0_4_ = local_278;
  local_498._8_4_ = iStack_270;
  local_498._12_4_ = iStack_26c;
  local_248 = local_488._0_4_ + iVar10 >> auVar14;
  iStack_244 = local_488._4_4_ + iVar10 >> auVar14;
  iStack_240 = local_488._8_4_ + iVar10 >> auVar14;
  iStack_23c = local_488._12_4_ + iVar10 >> auVar14;
  local_298 = local_478._0_4_ + iVar10 >> auVar14;
  iStack_294 = local_478._4_4_ + iVar10 >> auVar14;
  iStack_290 = local_478._8_4_ + iVar10 >> auVar14;
  iStack_28c = local_478._12_4_ + iVar10 >> auVar14;
  local_488._4_4_ = iStack_244;
  local_488._0_4_ = local_248;
  local_488._8_4_ = iStack_240;
  local_488._12_4_ = iStack_23c;
  local_478._4_4_ = iStack_294;
  local_478._0_4_ = local_298;
  local_478._8_4_ = iStack_290;
  local_478._12_4_ = iStack_28c;
  local_258 = local_468._0_4_ + iVar10 >> auVar14;
  iStack_254 = local_468._4_4_ + iVar10 >> auVar14;
  iStack_250 = local_468._8_4_ + iVar10 >> auVar14;
  iStack_24c = local_468._12_4_ + iVar10 >> auVar14;
  local_468._4_4_ = iStack_254;
  local_468._0_4_ = local_258;
  local_468._8_4_ = iStack_250;
  local_468._12_4_ = iStack_24c;
  local_2b8 = local_458 + iVar10 >> auVar14;
  iStack_2b4 = iStack_454 + iVar10 >> auVar14;
  iStack_2b0 = iStack_450 + iVar10 >> auVar14;
  iStack_2ac = iStack_44c + iVar10 >> auVar14;
  iStack_454 = iStack_2b4;
  local_458 = local_2b8;
  iStack_450 = iStack_2b0;
  iStack_44c = iStack_2ac;
  local_448._0_4_ = local_448._0_4_ + iVar10 >> auVar14;
  local_178 = local_448._4_4_ + iVar10 >> auVar14;
  iStack_160 = local_448._8_4_ + iVar10 >> auVar14;
  local_438 = local_438 + iVar10 >> auVar14;
  iStack_1f4 = iStack_434 + iVar10 >> auVar14;
  iStack_1dc = iStack_430 + iVar10 >> auVar14;
  iStack_42c = iStack_42c + iVar10 >> auVar14;
  local_448._4_4_ = local_178;
  local_448._8_4_ = iStack_160;
  local_448._12_4_ = local_448._12_4_ + iVar10 >> auVar14;
  iStack_434 = iStack_1f4;
  iStack_430 = iStack_1dc;
  local_268 = local_428 + iVar10 >> auVar14;
  iStack_264 = iStack_424 + iVar10 >> auVar14;
  iStack_260 = iStack_420 + iVar10 >> auVar14;
  iStack_25c = iStack_41c + iVar10 >> auVar14;
  iStack_424 = iStack_264;
  local_428 = local_268;
  iStack_420 = iStack_260;
  iStack_41c = iStack_25c;
  local_318 = local_408._0_4_ + iVar10;
  iStack_314 = local_408._4_4_ + iVar10;
  iStack_310 = local_408._8_4_ + iVar10;
  iStack_30c = local_408._12_4_ + iVar10;
  local_418._0_4_ = local_418._0_4_ + iVar10 >> auVar14;
  iStack_110 = local_418._4_4_ + iVar10 >> auVar14;
  iStack_d0 = local_418._12_4_ + iVar10 >> auVar14;
  local_418._4_4_ = iStack_110;
  local_418._8_4_ = local_418._8_4_ + iVar10 >> auVar14;
  local_418._12_4_ = iStack_d0;
  iStack_90 = iStack_314 >> auVar14;
  local_78 = iStack_310 >> auVar14;
  iStack_50 = iStack_30c >> auVar14;
  local_3f8._0_4_ = local_3f8._0_4_ + iVar10 >> auVar14;
  iStack_10c = local_3f8._4_4_ + iVar10 >> auVar14;
  iStack_cc = local_3f8._12_4_ + iVar10 >> auVar14;
  local_408._4_4_ = iStack_90;
  local_408._0_4_ = local_318 >> auVar14;
  local_408._8_4_ = local_78;
  local_408._12_4_ = iStack_50;
  local_3f8._4_4_ = iStack_10c;
  local_3f8._8_4_ = local_3f8._8_4_ + iVar10 >> auVar14;
  local_3f8._12_4_ = iStack_cc;
  iStack_8c = local_3e8._4_4_ + iVar10 >> auVar14;
  iStack_74 = local_3e8._8_4_ + iVar10 >> auVar14;
  iStack_4c = local_3e8._12_4_ + iVar10 >> auVar14;
  local_3e8._4_4_ = iStack_8c;
  local_3e8._0_4_ = local_3e8._0_4_ + iVar10 >> auVar14;
  local_3e8._8_4_ = iStack_74;
  local_3e8._12_4_ = iStack_4c;
  local_3d8._0_4_ = local_3d8._0_4_ + iVar10 >> auVar14;
  local_108 = local_3d8._4_4_ + iVar10 >> auVar14;
  iStack_f0 = local_3d8._8_4_ + iVar10 >> auVar14;
  local_c8 = local_3d8._12_4_ + iVar10 >> auVar14;
  local_3d8._4_4_ = local_108;
  local_3d8._8_4_ = iStack_f0;
  local_3d8._12_4_ = local_c8;
  local_3c8._0_4_ = local_3c8._0_4_ + iVar10 >> auVar14;
  iStack_70 = local_3c8._8_4_ + iVar10 >> auVar14;
  local_3b8._0_4_ = local_3b8._0_4_ + iVar10 >> auVar14;
  iStack_104 = local_3b8._4_4_ + iVar10 >> auVar14;
  iStack_ec = local_3b8._8_4_ + iVar10 >> auVar14;
  iStack_c4 = local_3b8._12_4_ + iVar10 >> auVar14;
  local_3c8._4_4_ = local_3c8._4_4_ + iVar10 >> auVar14;
  local_3c8._8_4_ = iStack_70;
  local_3c8._12_4_ = local_3c8._12_4_ + iVar10 >> auVar14;
  local_3b8._4_4_ = iStack_104;
  local_3b8._8_4_ = iStack_ec;
  local_3b8._12_4_ = iStack_c4;
  local_3a8._0_4_ = local_3a8._0_4_ + iVar10 >> auVar14;
  iStack_6c = local_3a8._8_4_ + iVar10 >> auVar14;
  local_3a8._4_4_ = local_3a8._4_4_ + iVar10 >> auVar14;
  local_3a8._8_4_ = iStack_6c;
  local_3a8._12_4_ = local_3a8._12_4_ + iVar10 >> auVar14;
  local_398 = local_398 + iVar10 >> auVar14;
  iStack_100 = iStack_394 + iVar10 >> auVar14;
  local_e8 = iStack_390 + iVar10 >> auVar14;
  iStack_c0 = iStack_38c + iVar10 >> auVar14;
  iStack_394 = iStack_100;
  iStack_390 = local_e8;
  iStack_38c = iStack_c0;
  iVar30 = (int)local_388 + iVar10 >> auVar14;
  iVar33 = local_388._4_4_ + iVar10 >> auVar14;
  iStack_380 = iStack_380 + iVar10 >> auVar14;
  iStack_37c = iStack_37c + iVar10 >> auVar14;
  local_378 = local_378 + iVar10 >> auVar14;
  iStack_fc = iStack_374 + iVar10 >> auVar14;
  iStack_e4 = iStack_370 + iVar10 >> auVar14;
  iStack_bc = iStack_36c + iVar10 >> auVar14;
  local_388 = CONCAT44(iVar33,iVar30);
  iStack_374 = iStack_fc;
  iStack_370 = iStack_e4;
  iStack_36c = iStack_bc;
  local_368 = local_368 + iVar10 >> auVar14;
  iStack_364 = iStack_364 + iVar10 >> auVar14;
  iStack_360 = iStack_360 + iVar10 >> auVar14;
  iStack_35c = iStack_35c + iVar10 >> auVar14;
  local_358 = local_358 + iVar10 >> auVar14;
  local_f8 = iStack_354 + iVar10 >> auVar14;
  iStack_e0 = iStack_350 + iVar10 >> auVar14;
  iStack_34c = iStack_34c + iVar10 >> auVar14;
  iStack_354 = local_f8;
  iStack_350 = iStack_e0;
  iVar24 = (int)local_348 + iVar10 >> auVar14;
  iVar26 = local_348._4_4_ + iVar10 >> auVar14;
  iStack_340 = iStack_340 + iVar10 >> auVar14;
  iStack_33c = iStack_33c + iVar10 >> auVar14;
  local_338 = local_338 + iVar10 >> auVar14;
  iStack_f4 = iStack_334 + iVar10 >> auVar14;
  iStack_dc = iStack_330 + iVar10 >> auVar14;
  iStack_32c = iStack_32c + iVar10 >> auVar14;
  local_348 = CONCAT44(iVar26,iVar24);
  iStack_334 = iStack_f4;
  iStack_330 = iStack_dc;
  local_328 = iVar10 + local_328 >> auVar14;
  iStack_324 = iVar10 + iStack_324 >> auVar14;
  iStack_320 = iVar10 + iStack_320 >> auVar14;
  iStack_31c = iVar10 + iStack_31c >> auVar14;
  uStack_230 = CONCAT44(local_308,local_2f8);
  local_238 = CONCAT44(local_2e8,local_2d8);
  uStack_1b0 = CONCAT44(local_2c8,local_2a8);
  uStack_220 = CONCAT44(local_438,local_2b8);
  local_228 = CONCAT44(local_298,local_278);
  local_1b8 = CONCAT44(iStack_42c,iStack_2ac);
  uStack_1a0 = CONCAT44(local_268,local_448._0_4_);
  local_1a8 = CONCAT44(local_258,local_248);
  local_138 = CONCAT44(local_3f8._0_4_,local_418._0_4_);
  uStack_130 = CONCAT44(local_3b8._0_4_,local_3d8._0_4_);
  uStack_b0 = CONCAT44(local_3a8._0_4_,local_3c8._0_4_);
  local_128 = CONCAT44(local_378,local_398);
  uStack_120 = CONCAT44(local_338,local_358);
  _local_b8 = CONCAT44(iStack_32c,iStack_34c);
  auVar39._8_4_ = iVar33;
  auVar39._0_8_ = local_388;
  auVar39._12_4_ = iStack_364;
  auVar36._4_4_ = local_368;
  auVar36._0_4_ = iVar30;
  auVar22._0_8_ = CONCAT44(iStack_360,iStack_380);
  auVar22._8_4_ = iStack_37c;
  auVar22._12_4_ = iStack_35c;
  auVar25._8_4_ = iVar26;
  auVar25._0_8_ = local_348;
  auVar25._12_4_ = iStack_324;
  auVar36._12_4_ = local_328;
  auVar36._8_4_ = iVar24;
  auVar27._0_8_ = CONCAT44(iStack_320,iStack_340);
  auVar27._8_4_ = iStack_33c;
  auVar27._12_4_ = iStack_31c;
  auVar40._8_8_ = auVar25._8_8_;
  auVar40._0_8_ = auVar39._8_8_;
  local_48 = auVar22._8_8_;
  uStack_40 = auVar27._8_8_;
  lVar9 = 0;
  iStack_210 = iStack_2d4;
  iStack_20c = iStack_2e4;
  local_208 = iStack_2f4;
  iStack_204 = iStack_304;
  iStack_200 = iStack_274;
  iStack_1fc = iStack_294;
  local_1f8 = iStack_2b4;
  iStack_1f0 = iStack_2f0;
  iStack_1ec = iStack_300;
  local_1e8 = iStack_270;
  iStack_1e4 = iStack_290;
  iStack_1e0 = iStack_2b0;
  iStack_1d0 = iStack_2cc;
  iStack_1cc = iStack_2dc;
  local_1c8 = iStack_2ec;
  iStack_1c4 = iStack_2fc;
  iStack_1c0 = iStack_26c;
  iStack_1bc = iStack_28c;
  iStack_18c = iStack_284;
  local_188 = iStack_2a4;
  iStack_184 = iStack_2c4;
  iStack_180 = iStack_244;
  iStack_17c = iStack_254;
  iStack_174 = iStack_264;
  iStack_170 = iStack_2a0;
  iStack_16c = iStack_2c0;
  local_168 = iStack_240;
  iStack_164 = iStack_250;
  iStack_15c = iStack_260;
  iStack_14c = iStack_27c;
  local_148 = iStack_29c;
  iStack_144 = iStack_2bc;
  iStack_140 = iStack_23c;
  iStack_13c = iStack_24c;
  local_a8 = auVar36;
  local_88 = auVar40;
  local_68 = auVar22._0_8_;
  uStack_60 = auVar27._0_8_;
  do {
    (*pcVar3)(&local_238 + lVar9 * 0x20,&local_238,0xd,2);
    bVar2 = piVar4[2];
    iVar10 = (int)(char)bVar2;
    if (iVar10 < 0) {
      iVar24 = 1 << (~bVar2 & 0x1f);
      lVar5 = 0;
      auVar36 = pmovsxwd(auVar36,0x16a116a116a116a1);
      auVar40 = pmovsxwd(auVar40,0x800080008000800);
      do {
        auVar27 = ZEXT416((uint)-iVar10);
        auVar17._0_4_ = *(int *)((long)&local_238 + lVar5) + iVar24 >> auVar27;
        auVar17._4_4_ = *(int *)((long)&local_238 + lVar5 + 4) + iVar24 >> auVar27;
        auVar17._8_4_ = *(int *)((long)&uStack_230 + lVar5) + iVar24 >> auVar27;
        auVar17._12_4_ = *(int *)((long)&uStack_230 + lVar5 + 4) + iVar24 >> auVar27;
        auVar14 = pmulld(auVar17,auVar36);
        *(int *)((long)&local_238 + lVar5) = auVar14._0_4_ + auVar40._0_4_ >> 0xc;
        *(int *)((long)&local_238 + lVar5 + 4) = auVar14._4_4_ + auVar40._4_4_ >> 0xc;
        *(int *)((long)&uStack_230 + lVar5) = auVar14._8_4_ + auVar40._8_4_ >> 0xc;
        *(int *)((long)&uStack_230 + lVar5 + 4) = auVar14._12_4_ + auVar40._12_4_ >> 0xc;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x100);
    }
    else {
      lVar5 = 0;
      auVar27 = pmovsxwd(auVar27,0x16a116a116a116a1);
      auVar36 = pmovsxwd(auVar36,0x800080008000800);
      do {
        auVar15._0_4_ = *(int *)((long)&local_238 + lVar5) << iVar10;
        auVar15._4_4_ = *(undefined4 *)((long)&local_238 + lVar5 + 4);
        auVar15._8_4_ = *(undefined4 *)((long)&uStack_230 + lVar5);
        auVar15._12_4_ = *(undefined4 *)((long)&uStack_230 + lVar5 + 4);
        auVar14 = pmulld(auVar15,auVar27);
        *(int *)((long)&local_238 + lVar5) = auVar14._0_4_ + auVar36._0_4_ >> 0xc;
        *(int *)((long)&local_238 + lVar5 + 4) = auVar14._4_4_ + auVar36._4_4_ >> 0xc;
        *(int *)((long)&uStack_230 + lVar5) = auVar14._8_4_ + auVar36._8_4_ >> 0xc;
        *(int *)((long)&uStack_230 + lVar5 + 4) = auVar14._12_4_ + auVar36._12_4_ >> 0xc;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x100);
    }
    *(undefined8 *)(coeff + lVar9 * 8) = local_238;
    *(undefined8 *)(coeff + lVar9 * 8 + 2) = uStack_230;
    *(undefined8 *)(coeff + lVar9 * 8 + 4) = local_228;
    *(undefined8 *)(coeff + lVar9 * 8 + 4 + 2) = uStack_220;
    *(undefined8 *)(coeff + lVar9 * 8 + 0x10) = local_218;
    *(ulong *)(coeff + lVar9 * 8 + 0x10 + 2) = CONCAT44(iStack_20c,iStack_210);
    *(ulong *)(coeff + lVar9 * 8 + 0x14) = CONCAT44(iStack_204,local_208);
    *(ulong *)(coeff + lVar9 * 8 + 0x14 + 2) = CONCAT44(iStack_1fc,iStack_200);
    *(ulong *)(coeff + lVar9 * 8 + 0x20) = CONCAT44(iStack_1f4,local_1f8);
    *(ulong *)(coeff + lVar9 * 8 + 0x20 + 2) = CONCAT44(iStack_1ec,iStack_1f0);
    *(ulong *)(coeff + lVar9 * 8 + 0x24) = CONCAT44(iStack_1e4,local_1e8);
    *(ulong *)(coeff + lVar9 * 8 + 0x24 + 2) = CONCAT44(iStack_1dc,iStack_1e0);
    *(undefined8 *)(coeff + lVar9 * 8 + 0x30) = local_1d8;
    *(ulong *)(coeff + lVar9 * 8 + 0x30 + 2) = CONCAT44(iStack_1cc,iStack_1d0);
    *(ulong *)(coeff + lVar9 * 8 + 0x34) = CONCAT44(iStack_1c4,local_1c8);
    *(ulong *)(coeff + lVar9 * 8 + 0x34 + 2) = CONCAT44(iStack_1bc,iStack_1c0);
    *(undefined8 *)(coeff + lVar9 * 8 + 0x40) = local_1b8;
    *(undefined8 *)(coeff + lVar9 * 8 + 0x40 + 2) = uStack_1b0;
    *(undefined8 *)(coeff + lVar9 * 8 + 0x44) = local_1a8;
    *(undefined8 *)(coeff + lVar9 * 8 + 0x44 + 2) = uStack_1a0;
    *(undefined8 *)(coeff + lVar9 * 8 + 0x50) = local_198;
    *(ulong *)(coeff + lVar9 * 8 + 0x50 + 2) = CONCAT44(iStack_18c,iStack_190);
    *(ulong *)(coeff + lVar9 * 8 + 0x54) = CONCAT44(iStack_184,local_188);
    *(ulong *)(coeff + lVar9 * 8 + 0x54 + 2) = CONCAT44(iStack_17c,iStack_180);
    *(ulong *)(coeff + lVar9 * 8 + 0x60) = CONCAT44(iStack_174,local_178);
    *(ulong *)(coeff + lVar9 * 8 + 0x60 + 2) = CONCAT44(iStack_16c,iStack_170);
    *(ulong *)(coeff + lVar9 * 8 + 100) = CONCAT44(iStack_164,local_168);
    *(ulong *)(coeff + lVar9 * 8 + 100 + 2) = CONCAT44(iStack_15c,iStack_160);
    *(undefined8 *)(coeff + lVar9 * 8 + 0x70) = local_158;
    *(ulong *)(coeff + lVar9 * 8 + 0x70 + 2) = CONCAT44(iStack_14c,iStack_150);
    *(ulong *)(coeff + lVar9 * 8 + 0x74) = CONCAT44(iStack_144,local_148);
    *(ulong *)(coeff + lVar9 * 8 + 0x74 + 2) = CONCAT44(iStack_13c,iStack_140);
    bVar13 = lVar9 == 0;
    lVar9 = lVar9 + 1;
  } while (bVar13);
  return;
}

Assistant:

void av1_fwd_txfm2d_8x16_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[32], out[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x16_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x8_arr[tx_type];
  int bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_8x16(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, in, bit, 2);
  col_txfm_8x16_rounding(in, -shift[1]);
  transpose_8x8(in, out);
  transpose_8x8(in + 16, out + 16);

  for (int i = 0; i < 2; i++) {
    row_txfm(out + i * 16, out, bit, 2);
    av1_round_shift_rect_array_32_sse4_1(out, out, 16, -shift[2], NewSqrt2);
    write_buffer_16x8(out, coeff + i * 8, 16);
  }
  (void)bd;
}